

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
create_new_data_nodes
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          data_node_type *old_node,model_node_type *parent,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,int start_bucketID,int extra_duplication_factor)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pFVar5;
  self_type *psVar6;
  bool keep_left;
  double dVar7;
  bool keep_right;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  data_node_type *pdVar13;
  data_node_type *pdVar14;
  long lVar15;
  uint uVar16;
  int left;
  int pos;
  FTNode *tree_node;
  pointer tree_node_00;
  int iVar17;
  undefined8 in_XMM0_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 in_XMM3_Qb;
  
  auVar18._0_8_ = (double)old_node->max_key_;
  auVar18._8_8_ = in_XMM0_Qa;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (parent->super_AlexNode<int,_int>).model_.a_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (parent->super_AlexNode<int,_int>).model_.b_;
  tree_node_00 = (used_fanout_tree_nodes->
                 super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = parent->num_children_ - 1;
  auVar18 = vfmadd213sd_fma(auVar18,auVar21,auVar23);
  auVar19._0_8_ = (double)old_node->min_key_;
  auVar19._8_8_ = in_XMM3_Qb;
  uVar8 = ~((int)auVar18._0_8_ >> 0x1f) & (int)auVar18._0_8_;
  if ((int)uVar16 < (int)uVar8) {
    uVar8 = uVar16;
  }
  auVar18 = vfmadd213sd_fma(auVar19,auVar21,auVar23);
  uVar9 = ~((int)auVar18._0_8_ >> 0x1f) & (int)auVar18._0_8_;
  pdVar13 = old_node->prev_leaf_;
  if ((int)uVar9 <= (int)uVar16) {
    uVar16 = uVar9;
  }
  pFVar5 = (used_fanout_tree_nodes->
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (tree_node_00 != pFVar5) {
    iVar2 = old_node->num_right_out_of_bounds_inserts_;
    iVar17 = 0;
    iVar3 = old_node->num_inserts_;
    iVar4 = old_node->num_left_out_of_bounds_inserts_;
    pdVar14 = pdVar13;
    left = 0;
    do {
      keep_left = false;
      uVar9 = (fanout_tree_depth - tree_node_00->level) + extra_duplication_factor;
      iVar10 = 1 << (uVar9 & 0x1f);
      if ((0.9 < (double)iVar2 / (double)iVar3) && (start_bucketID <= (int)uVar8)) {
        keep_left = (int)uVar8 < iVar10 + start_bucketID;
      }
      if ((double)iVar4 / (double)iVar3 <= 0.9) {
        keep_right = false;
      }
      else {
        keep_right = false;
        if (start_bucketID <= (int)uVar16) {
          keep_right = (int)uVar16 < iVar10 + start_bucketID;
        }
      }
      pos = tree_node_00->right_boundary;
      iVar11 = tree_node_00->num_keys - iVar17;
      tree_node_00->num_keys = iVar11;
      if (pos < old_node->data_capacity_) {
        iVar17 = 0;
        do {
          if ((old_node->key_slots_[pos] == 0x7fffffff) ||
             (auVar20._8_8_ = 0, auVar20._0_8_ = (parent->super_AlexNode<int,_int>).model_.a_,
             auVar22._0_8_ = (double)old_node->key_slots_[pos], auVar22._8_8_ = in_XMM3_Qb,
             auVar1._8_8_ = 0, auVar1._0_8_ = (parent->super_AlexNode<int,_int>).model_.b_,
             auVar18 = vfmadd213sd_fma(auVar22,auVar20,auVar1),
             iVar10 + start_bucketID <= (int)auVar18._0_8_)) break;
          iVar17 = iVar17 + 1;
          iVar12 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                   ::get_next_filled_position(old_node,pos,false);
          iVar11 = old_node->data_capacity_;
          iVar12 = iVar12 + 1;
          pos = iVar12;
          if (iVar11 < iVar12) {
            pos = iVar11;
          }
        } while (iVar12 < iVar11);
        iVar11 = tree_node_00->num_keys;
      }
      else {
        iVar17 = 0;
      }
      tree_node_00->num_keys = iVar11 + iVar17;
      pdVar13 = bulk_load_leaf_node_from_existing
                          (this,old_node,left,pos,false,tree_node_00,false,keep_left,keep_right);
      (pdVar13->super_AlexNode<int,_int>).level_ = (parent->super_AlexNode<int,_int>).level_ + 1;
      (pdVar13->super_AlexNode<int,_int>).cost_ = tree_node_00->cost;
      (pdVar13->super_AlexNode<int,_int>).duplication_factor_ = (uint8_t)uVar9;
      dVar7 = tree_node_00->expected_avg_shifts;
      pdVar13->expected_avg_exp_search_iterations_ = tree_node_00->expected_avg_search_iterations;
      pdVar13->expected_avg_shifts_ = dVar7;
      pdVar13->prev_leaf_ = pdVar14;
      if (pdVar14 != (data_node_type *)0x0) {
        pdVar14->next_leaf_ = pdVar13;
      }
      if ((uVar9 & 0xff) != 0x1f) {
        lVar15 = (long)start_bucketID;
        do {
          parent->children_[lVar15] = &pdVar13->super_AlexNode<int,_int>;
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar10 + start_bucketID);
      }
      tree_node_00 = tree_node_00 + 1;
      pdVar14 = pdVar13;
      left = pos;
      start_bucketID = iVar10 + start_bucketID;
    } while (tree_node_00 != pFVar5);
  }
  psVar6 = old_node->next_leaf_;
  pdVar13->next_leaf_ = psVar6;
  if (psVar6 != (self_type *)0x0) {
    psVar6->prev_leaf_ = pdVar13;
  }
  return;
}

Assistant:

void create_new_data_nodes(
      const data_node_type* old_node, model_node_type* parent,
      int fanout_tree_depth,
      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
      int start_bucketID = 0, int extra_duplication_factor = 0) {
    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    // Create the new data nodes
    int cur = start_bucketID;  // first bucket with same child
    data_node_type* prev_leaf =
        old_node->prev_leaf_;  // used for linking the new data nodes
    int left_boundary = 0;
    int right_boundary = 0;
    // Keys may be re-assigned to an adjacent fanout tree node due to off-by-one
    // errors
    int num_reassigned_keys = 0;
    for (fanout_tree::FTNode& tree_node : used_fanout_tree_nodes) {
      left_boundary = right_boundary;
      auto duplication_factor = static_cast<uint8_t>(
          fanout_tree_depth - tree_node.level + extra_duplication_factor);
      int child_node_repeats = 1 << duplication_factor;
      bool keep_left = append_mostly_right && cur <= appending_right_bucketID &&
                       appending_right_bucketID < cur + child_node_repeats;
      bool keep_right = append_mostly_left && cur <= appending_left_bucketID &&
                        appending_left_bucketID < cur + child_node_repeats;
      right_boundary = tree_node.right_boundary;
      // Account for off-by-one errors due to floating-point precision issues.
      tree_node.num_keys -= num_reassigned_keys;
      num_reassigned_keys = 0;
      while (right_boundary < old_node->data_capacity_ &&
             old_node->get_key(right_boundary) !=
                 data_node_type::kEndSentinel_ &&
             parent->model_.predict(old_node->get_key(right_boundary)) <
                 cur + child_node_repeats) {
        num_reassigned_keys++;
        right_boundary = std::min(
            old_node->get_next_filled_position(right_boundary, false) + 1,
            old_node->data_capacity_);
      }
      tree_node.num_keys += num_reassigned_keys;
      data_node_type* child_node = bulk_load_leaf_node_from_existing(
          old_node, left_boundary, right_boundary, false, &tree_node, false,
          keep_left, keep_right);
      child_node->level_ = static_cast<short>(parent->level_ + 1);
      child_node->cost_ = tree_node.cost;
      child_node->duplication_factor_ = duplication_factor;
      child_node->expected_avg_exp_search_iterations_ =
          tree_node.expected_avg_search_iterations;
      child_node->expected_avg_shifts_ = tree_node.expected_avg_shifts;
      child_node->prev_leaf_ = prev_leaf;
      if (prev_leaf != nullptr) {
        prev_leaf->next_leaf_ = child_node;
      }
      for (int i = cur; i < cur + child_node_repeats; i++) {
        parent->children_[i] = child_node;
      }
      cur += child_node_repeats;
      prev_leaf = child_node;
    }
    prev_leaf->next_leaf_ = old_node->next_leaf_;
    if (old_node->next_leaf_ != nullptr) {
      old_node->next_leaf_->prev_leaf_ = prev_leaf;
    }
  }